

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall ParserData::~ParserData(ParserData *this)

{
  bool bVar1;
  reference ppFVar2;
  FunctionNode *f;
  iterator __end1;
  iterator __begin1;
  vector<FunctionNode_*,_std::allocator<FunctionNode_*>_> *__range1;
  ParserData *this_local;
  
  __end1 = std::vector<FunctionNode_*,_std::allocator<FunctionNode_*>_>::begin(&this->functions);
  f = (FunctionNode *)
      std::vector<FunctionNode_*,_std::allocator<FunctionNode_*>_>::end(&this->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<FunctionNode_**,_std::vector<FunctionNode_*,_std::allocator<FunctionNode_*>_>_>
                                *)&f);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<FunctionNode_**,_std::vector<FunctionNode_*,_std::allocator<FunctionNode_*>_>_>
              ::operator*(&__end1);
    if (*ppFVar2 != (FunctionNode *)0x0) {
      (*((*ppFVar2)->super_Node)._vptr_Node[1])();
    }
    __gnu_cxx::
    __normal_iterator<FunctionNode_**,_std::vector<FunctionNode_*,_std::allocator<FunctionNode_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<FunctionNode_*,_std::allocator<FunctionNode_*>_>::~vector(&this->functions);
  std::__cxx11::string::~string((string *)&this->fn);
  return;
}

Assistant:

~ParserData() {
    for (FunctionNode* f : functions)
      delete f;
  }